

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O3

ALCuint __thiscall anon_unknown.dwarf_254152::AlsaCapture::availableSamples(AlsaCapture *this)

{
  RingBuffer *pRVar1;
  FILE *__stream;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  long lVar6;
  ll_ringbuffer_data_pair vec;
  undefined8 local_50;
  ulong local_48;
  
  if ((((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) == 0) ||
     (this->mDoCapture != true)) {
    if ((this->mRing)._M_t.super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
        super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
        super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl != (RingBuffer *)0x0)
    goto LAB_001630d8;
    uVar5 = 0;
  }
  else {
    uVar3 = (*(anonymous_namespace)::psnd_pcm_avail_update)(this->mPcmHandle);
    __stream = gLogFile;
    if ((long)uVar3 < 0) {
      if (0 < (int)gLogLevel) {
        uVar4 = (*(anonymous_namespace)::psnd_strerror)(uVar3 & 0xffffffff);
        fprintf((FILE *)__stream,"[ALSOFT] (EE) avail update failed: %s\n",uVar4);
      }
      iVar2 = (*(anonymous_namespace)::psnd_pcm_recover)(this->mPcmHandle,uVar3 & 0xffffffff,1);
      uVar3 = (ulong)iVar2;
      if (iVar2 < 0) {
LAB_00162fc3:
        if (-1 < (long)uVar3) goto LAB_00162ff4;
      }
      else {
        if (this->mDoCapture == true) {
          iVar2 = (*(anonymous_namespace)::psnd_pcm_start)(this->mPcmHandle);
          uVar3 = (ulong)iVar2;
        }
        if (-1 < (long)uVar3) {
          uVar3 = (*(anonymous_namespace)::psnd_pcm_avail_update)(this->mPcmHandle);
          goto LAB_00162fc3;
        }
      }
      uVar4 = (*(anonymous_namespace)::psnd_strerror)(uVar3 & 0xffffffff);
      if (0 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (EE) restore error: %s\n",uVar4);
      }
      ALCdevice::handleDisconnect
                ((this->super_BackendBase).mDevice,"Capture recovery failure: %s",uVar4);
    }
LAB_00162ff4:
    if ((this->mRing)._M_t.super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
        super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
        super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl != (RingBuffer *)0x0) {
      do {
        do {
          while( true ) {
            if (((long)uVar3 < 1) ||
               (RingBuffer::getWriteVector
                          ((this->mRing)._M_t.
                           super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                           super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                           super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl), local_48 == 0))
            goto LAB_001630d8;
            uVar5 = local_48;
            if ((long)uVar3 < (long)local_48) {
              uVar5 = uVar3;
            }
            uVar5 = (*(anonymous_namespace)::psnd_pcm_readi)(this->mPcmHandle,local_50,uVar5);
            if ((long)uVar5 < 0) break;
            RingBuffer::writeAdvance
                      ((this->mRing)._M_t.
                       super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                       super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                       super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl,uVar5);
            uVar3 = uVar3 - uVar5;
          }
          if (0 < (int)gLogLevel) {
            _GLOBAL__N_1::AlsaCapture::availableSamples();
          }
        } while (uVar5 == 0xfffffffffffffff5);
        iVar2 = (*(anonymous_namespace)::psnd_pcm_recover)(this->mPcmHandle,uVar5 & 0xffffffff,1);
        uVar3 = (ulong)iVar2;
        if (-1 < iVar2) {
          if (this->mDoCapture == true) {
            iVar2 = (*(anonymous_namespace)::psnd_pcm_start)(this->mPcmHandle);
            uVar3 = (ulong)iVar2;
          }
          if ((long)uVar3 < 0) break;
          uVar3 = (*(anonymous_namespace)::psnd_pcm_avail_update)(this->mPcmHandle);
        }
      } while (-1 < (long)uVar3);
      uVar4 = (*(anonymous_namespace)::psnd_strerror)(uVar3 & 0xffffffff);
      if (0 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (EE) restore error: %s\n",uVar4);
      }
      ALCdevice::handleDisconnect
                ((this->super_BackendBase).mDevice,"Capture recovery failure: %s",uVar4);
LAB_001630d8:
      pRVar1 = (this->mRing)._M_t.
               super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
               super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
               super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl;
      uVar3 = (__int_type_conflict2)(pRVar1->mWritePtr).super___atomic_base<unsigned_long> -
              (pRVar1->mReadPtr).super___atomic_base<unsigned_long>._M_i & pRVar1->mSizeMask;
      goto LAB_00163123;
    }
    uVar5 = 0;
    if (0 < (long)uVar3) {
      uVar5 = uVar3;
    }
  }
  lVar6 = (*(anonymous_namespace)::psnd_pcm_bytes_to_frames)
                    (this->mPcmHandle,
                     (long)(this->mBuffer).
                           super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->mBuffer).
                           super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
                           super__Vector_impl_data._M_start);
  uVar5 = lVar6 + uVar5;
  uVar3 = this->mLastAvail;
  if (this->mLastAvail < (long)uVar5) {
    this->mLastAvail = uVar5;
    uVar3 = uVar5;
  }
LAB_00163123:
  return (ALCuint)uVar3;
}

Assistant:

ALCuint AlsaCapture::availableSamples()
{
    snd_pcm_sframes_t avail{0};
    if(mDevice->Connected.load(std::memory_order_acquire) && mDoCapture)
        avail = snd_pcm_avail_update(mPcmHandle);
    if(avail < 0)
    {
        ERR("avail update failed: %s\n", snd_strerror(static_cast<int>(avail)));

        if((avail=snd_pcm_recover(mPcmHandle, static_cast<int>(avail), 1)) >= 0)
        {
            if(mDoCapture)
                avail = snd_pcm_start(mPcmHandle);
            if(avail >= 0)
                avail = snd_pcm_avail_update(mPcmHandle);
        }
        if(avail < 0)
        {
            const char *err{snd_strerror(static_cast<int>(avail))};
            ERR("restore error: %s\n", err);
            mDevice->handleDisconnect("Capture recovery failure: %s", err);
        }
    }

    if(!mRing)
    {
        if(avail < 0) avail = 0;
        avail += snd_pcm_bytes_to_frames(mPcmHandle, static_cast<ssize_t>(mBuffer.size()));
        if(avail > mLastAvail) mLastAvail = avail;
        return static_cast<ALCuint>(mLastAvail);
    }

    while(avail > 0)
    {
        auto vec = mRing->getWriteVector();
        if(vec.first.len == 0) break;

        snd_pcm_sframes_t amt{std::min(static_cast<snd_pcm_sframes_t>(vec.first.len), avail)};
        amt = snd_pcm_readi(mPcmHandle, vec.first.buf, static_cast<snd_pcm_uframes_t>(amt));
        if(amt < 0)
        {
            ERR("read error: %s\n", snd_strerror(static_cast<int>(amt)));

            if(amt == -EAGAIN)
                continue;
            if((amt=snd_pcm_recover(mPcmHandle, static_cast<int>(amt), 1)) >= 0)
            {
                if(mDoCapture)
                    amt = snd_pcm_start(mPcmHandle);
                if(amt >= 0)
                    amt = snd_pcm_avail_update(mPcmHandle);
            }
            if(amt < 0)
            {
                const char *err{snd_strerror(static_cast<int>(amt))};
                ERR("restore error: %s\n", err);
                mDevice->handleDisconnect("Capture recovery failure: %s", err);
                break;
            }
            avail = amt;
            continue;
        }

        mRing->writeAdvance(static_cast<snd_pcm_uframes_t>(amt));
        avail -= amt;
    }

    return static_cast<ALCuint>(mRing->readSpace());
}